

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O3

void __thiscall
vox::VoxWriter::m_MergeVoxelInCube
          (VoxWriter *this,VoxelX *vX,VoxelY *vY,VoxelZ *vZ,uint8_t *vColorIndex,VoxCube *vCube)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer *ppuVar1;
  KeyFrame *__k;
  undefined1 auVar2 [16];
  _Rb_tree_color _Var3;
  int iVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  pointer puVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  _Rb_tree_header *p_Var14;
  iterator iVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uchar local_4b;
  uchar local_4a;
  uchar local_49;
  ulong *local_48;
  ulong *local_40;
  uint8_t *local_38;
  
  auVar19._0_8_ = (double)CONCAT44(0x43300000,(int)*vZ);
  auVar19._8_4_ = (int)(*vZ >> 0x20);
  auVar19._12_4_ = 0x45300000;
  dVar17 = (auVar19._8_8_ - 1.9342813113834067e+25) + (auVar19._0_8_ - 4503599627370496.0);
  auVar21._0_8_ =
       ((double)(*vX >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(*vX & 0xffffffff | 0x4330000000000000);
  auVar21._8_8_ =
       ((double)(*vY >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(*vY & 0xffffffff | 0x4330000000000000);
  auVar20._0_8_ = (this->maxVolume).lowerBound.x;
  auVar20._8_8_ = (this->maxVolume).lowerBound.y;
  auVar20 = minpd(auVar20,auVar21);
  (this->maxVolume).lowerBound.x = (double)auVar20._0_8_;
  (this->maxVolume).lowerBound.y = (double)auVar20._8_8_;
  dVar18 = (this->maxVolume).lowerBound.z;
  if (dVar17 <= dVar18) {
    dVar18 = dVar17;
  }
  (this->maxVolume).lowerBound.z = dVar18;
  auVar2._0_8_ = (this->maxVolume).upperBound.x;
  auVar2._8_8_ = (this->maxVolume).upperBound.y;
  auVar20 = maxpd(auVar2,auVar21);
  (this->maxVolume).upperBound.x = (double)auVar20._0_8_;
  (this->maxVolume).upperBound.y = (double)auVar20._8_8_;
  dVar18 = (this->maxVolume).upperBound.z;
  if (dVar18 <= dVar17) {
    dVar18 = dVar17;
  }
  (this->maxVolume).upperBound.z = dVar18;
  __k = &this->m_KeyFrame;
  p_Var6 = (this->voxelId)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_48 = vY;
  local_40 = vZ;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var14 = &(this->voxelId)._M_t._M_impl.super__Rb_tree_header;
    _Var3 = *__k;
    p_Var13 = &p_Var14->_M_header;
    do {
      bVar16 = p_Var6[1]._M_color < _Var3;
      if (!bVar16) {
        p_Var13 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar16];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var13 != p_Var14) && (p_Var13[1]._M_color <= _Var3)) {
      pmVar7 = std::
               map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
               ::at(&this->voxelId,__k);
      p_Var6 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var6 != (_Base_ptr)0x0) {
        p_Var14 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
        uVar5 = *vX;
        p_Var13 = &p_Var14->_M_header;
        do {
          if (*(ulong *)(p_Var6 + 1) >= uVar5) {
            p_Var13 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar5];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var13 != p_Var14) && (*(ulong *)(p_Var13 + 1) <= uVar5)) {
          pmVar8 = std::
                   map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
                   ::at(pmVar7,vX);
          p_Var6 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var6 != (_Base_ptr)0x0) {
            p_Var14 = &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
            uVar5 = *local_48;
            p_Var13 = &p_Var14->_M_header;
            do {
              if (*(ulong *)(p_Var6 + 1) >= uVar5) {
                p_Var13 = p_Var6;
              }
              p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar5];
            } while (p_Var6 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var13 != p_Var14) && (*(ulong *)(p_Var13 + 1) <= uVar5)) {
              pmVar9 = std::
                       map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                       ::at(pmVar8,local_48);
              p_Var6 = (pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              if (p_Var6 != (_Base_ptr)0x0) {
                p_Var14 = &(pmVar9->_M_t)._M_impl.super__Rb_tree_header;
                uVar5 = *local_40;
                p_Var13 = &p_Var14->_M_header;
                do {
                  if (*(ulong *)(p_Var6 + 1) >= uVar5) {
                    p_Var13 = p_Var6;
                  }
                  p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar5];
                } while (p_Var6 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var13 != p_Var14) && (*(ulong *)(p_Var13 + 1) <= uVar5)) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  local_38 = vColorIndex;
  pmVar10 = std::
            map<unsigned_int,_vox::XYZI,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vox::XYZI>_>_>
            ::operator[](&vCube->xyzis,__k);
  this_00 = &pmVar10->voxels;
  local_49 = (uchar)(*vX % this->m_MaxVoxelPerCubeX);
  iVar15._M_current =
       (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar15._M_current ==
      (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (this_00,iVar15,&local_49);
    iVar15._M_current =
         (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    *iVar15._M_current = local_49;
    iVar15._M_current =
         (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar15._M_current;
  }
  local_4a = (uchar)(*local_48 % this->m_MaxVoxelPerCubeY);
  if (iVar15._M_current ==
      (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (this_00,iVar15,&local_4a);
    iVar15._M_current =
         (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    *iVar15._M_current = local_4a;
    iVar15._M_current =
         (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar15._M_current;
  }
  local_4b = (uchar)(*local_40 % this->m_MaxVoxelPerCubeZ);
  if (iVar15._M_current ==
      (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (this_00,iVar15,&local_4b);
    puVar11 = (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar15._M_current = local_4b;
    puVar11 = (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar11;
  }
  iVar4 = *(int *)&(pmVar10->voxels).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  pmVar7 = std::
           map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
           ::operator[](&this->voxelId,__k);
  pmVar8 = std::
           map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
           ::operator[](pmVar7,vX);
  pmVar9 = std::
           map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           ::operator[](pmVar8,local_48);
  pmVar12 = std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::operator[](pmVar9,local_40);
  *pmVar12 = (long)((int)puVar11 - iVar4);
  iVar15._M_current =
       (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar15._M_current ==
      (pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,iVar15,local_38);
  }
  else {
    *iVar15._M_current = *local_38;
    ppuVar1 = &(pmVar10->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void VoxWriter::m_MergeVoxelInCube(const VoxelX& vX, const VoxelY& vY, const VoxelZ& vZ, const uint8_t& vColorIndex, VoxCube* vCube) {
    maxVolume.Combine(ct::dvec3((double)vX, (double)vY, (double)vZ));

    bool exist = false;
    if (voxelId.find(m_KeyFrame) != voxelId.end()) {
        auto& vidk = voxelId.at(m_KeyFrame);
        if (vidk.find(vX) != vidk.end()) {
            auto& vidkx = vidk.at(vX);
            if (vidkx.find(vY) != vidkx.end()) {
                auto& vidkxy = vidkx.at(vY);
                if (vidkxy.find(vZ) != vidkxy.end()) {
                    exist = true;
                }
            }
        }
    }

    if (!exist) {
        auto& xyzi = vCube->xyzis[m_KeyFrame];
        xyzi.voxels.push_back(Wrap(vX, m_MaxVoxelPerCubeX));                      // x
        xyzi.voxels.push_back(Wrap(vY, m_MaxVoxelPerCubeY));                      // y
        xyzi.voxels.push_back(Wrap(vZ, m_MaxVoxelPerCubeZ));                      // z

        // correspond a la loc de la couleur du voxel en question
        voxelId[m_KeyFrame][vX][vY][vZ] = (int)xyzi.voxels.size();

        xyzi.voxels.push_back(vColorIndex);  // color index
    }
}